

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
SetPropertyWithAttributes
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  Type *pTVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  PropertyAttributes PVar6;
  byte bVar7;
  uint32 index;
  int iVar8;
  BOOL BVar9;
  undefined4 *puVar10;
  PropertyRecord **ppPVar11;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar12;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_00;
  unsigned_short uVar13;
  ScriptContext *this_01;
  Var pvVar14;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  unsigned_short propertyIndex;
  undefined4 *local_50;
  PropertyValueInfo *local_48;
  Var local_40;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *local_38;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  local_48 = info;
  local_40 = value;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92a,"(instance)","instance");
    if (!bVar4) goto LAB_00c5f6e5;
    *puVar10 = 0;
  }
  this_01 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  _propertyIndex = this_01;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92f,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) goto LAB_00c5f6e5;
    *puVar10 = 0;
    this_01 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
  }
  local_68 = ScriptContext::GetPropertyName(this_01,propertyId);
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_68,&local_38);
  if (!bVar4) {
    if (local_68->isNumeric != true) {
      BVar9 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
              AddProperty<Js::PropertyRecord_const*>
                        ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                          *)this,instance,local_68,local_40,attributes,local_48,flags,
                         possibleSideEffects);
      return BVar9;
    }
    index = PropertyRecord::GetNumericValue(local_68);
    BVar9 = DynamicTypeHandler::SetItemWithAttributes
                      (&this->super_DynamicTypeHandler,instance,index,local_40,attributes);
    return BVar9;
  }
  bVar5 = local_38->Attributes;
  if ((bVar5 & 0x10) != (attributes & 0x10)) {
    pDVar12 = ConvertToDictionaryType(this,instance);
    iVar8 = (*(pDVar12->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                      (pDVar12,instance,(ulong)(uint)propertyId,local_40,(ulong)attributes,local_48,
                       (ulong)flags,(ulong)possibleSideEffects);
    return iVar8;
  }
  if ((bVar5 & 0x18) == 8) {
    bVar5 = (this->super_DynamicTypeHandler).flags;
    if ((bVar5 & 4) != 0) goto LAB_00c5f42e;
    pTVar1 = (instance->super_RecyclableObject).type.ptr;
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if (((bVar5 & 0x10) != 0) || (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')
         ) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_50 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x960,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar4) goto LAB_00c5f6e5;
        *local_50 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
    if (((this->field_0x28 & 2) != 0) &&
       (bVar4 = SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true>
                ::TryUndeleteProperty
                          ((SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true>
                            *)this,instance,local_38->propertyIndex,
                           (unsigned_short *)&propertyRecord), bVar4)) {
      ppPVar11 = JsUtil::
                 BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt((this->propertyMap).ptr,(uint)(ushort)propertyRecord);
      if (*ppPVar11 != local_68) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_50 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x96b,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord)"
                                   );
        if (!bVar4) goto LAB_00c5f6e5;
        *local_50 = 0;
      }
      local_38 = JsUtil::
                 BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt((this->propertyMap).ptr,(uint)(ushort)propertyRecord);
    }
    if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
       (bVar4 = DynamicTypeHandler::VerifyIsExtensible
                          (&this->super_DynamicTypeHandler,_propertyIndex,
                           SUB41((flags & PropertyOperation_ThrowIfNotExtensible) >> 2,0)), !bVar4))
    {
      return 0;
    }
    bVar4 = SupportsSwitchingToUnordered(this,_propertyIndex);
    if (bVar4) {
      this->numDeletedProperties = this->numDeletedProperties + 0xff;
    }
    ScriptContext::InvalidateProtoCaches(_propertyIndex,propertyId);
    local_38->Attributes = '\a';
    bVar5 = 7;
  }
  if (bVar5 != attributes) {
    bVar5 = (this->super_DynamicTypeHandler).flags;
    if ((bVar5 & 4) != 0) {
LAB_00c5f42e:
      this_00 = ConvertToNonSharedSimpleDictionaryType(this,instance);
      BVar9 = SetPropertyWithAttributes
                        (this_00,instance,propertyId,local_40,attributes,local_48,flags,
                         possibleSideEffects);
      return BVar9;
    }
    pTVar1 = (instance->super_RecyclableObject).type.ptr;
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if (((bVar5 & 0x10) != 0) || (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')
         ) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_50 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x997,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar4) goto LAB_00c5f6e5;
        *local_50 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
    local_38->Attributes = attributes;
  }
  pvVar14 = local_40;
  if (local_38->propertyIndex == 0xffff) goto LAB_00c5f641;
  pRVar2 = (this->singletonInstance).ptr;
  if (pRVar2 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    bVar4 = false;
  }
  else if ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef == instance) {
    bVar4 = true;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x9a5,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar4) goto LAB_00c5f6e5;
    *puVar10 = 0;
    bVar4 = false;
  }
  pvVar14 = local_40;
  if ((*(byte *)local_38 & 2) == 0) {
    if ((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (*(byte *)local_38 = *(byte *)local_38 | 2, bVar4)) &&
       ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < (uint)propertyId)) {
      if (((this->super_DynamicTypeHandler).flags & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9af,"(!GetIsShared())","!GetIsShared()");
        if (!bVar4) goto LAB_00c5f6e5;
        *puVar10 = 0;
      }
      if (pvVar14 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9b0,"(value != nullptr)","value != nullptr");
        if (!bVar4) goto LAB_00c5f6e5;
        *puVar10 = 0;
      }
      BVar9 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
      if (BVar9 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9b2,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar4) {
LAB_00c5f6e5:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar10 = 0;
      }
      bVar4 = VarIs<Js::JavascriptFunction>(pvVar14);
      if (bVar4) {
        bVar4 = DynamicTypeHandler::ShouldFixMethodProperties();
LAB_00c5f6c3:
        bVar5 = *(byte *)local_38;
        if (bVar4 == false) goto LAB_00c5f6d7;
        bVar7 = 4;
      }
      else {
        bVar4 = DynamicTypeHandler::ShouldFixDataProperties();
        if (bVar4) {
          bVar4 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,propertyId,pvVar14);
          goto LAB_00c5f6c3;
        }
        bVar5 = *(byte *)local_38;
LAB_00c5f6d7:
        bVar7 = 0;
      }
      *(byte *)local_38 = bVar5 & 0xfb | bVar7;
    }
  }
  else {
    SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
    InvalidateFixedField<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *)
               this,local_68,local_38,
               (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
  }
  pvVar14 = local_40;
  DynamicTypeHandler::SetSlotUnchecked(instance,(uint)local_38->propertyIndex,local_40);
  if (((uint)*local_38 & 6) == 2) {
    if (local_48 == (PropertyValueInfo *)0x0) goto LAB_00c5f641;
    PVar6 = local_38->Attributes;
    uVar13 = local_38->propertyIndex;
  }
  else {
    if (local_48 == (PropertyValueInfo *)0x0) goto LAB_00c5f641;
    uVar13 = 0xffff;
    PVar6 = '\0';
  }
  local_48->m_instance = &instance->super_RecyclableObject;
  local_48->m_propertyIndex = uVar13;
  local_48->m_attributes = PVar6;
  local_48->flags = InlineCacheNoFlags;
LAB_00c5f641:
  if ((local_38->Attributes & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
  }
  Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::WriteBarrierSet
            ((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
             &propertyRecord,
             &((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              typesWithOnlyWritablePropertyProtoChain);
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
            ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)
             CONCAT62(propertyRecord._2_6_,(ushort)propertyRecord),&this->super_DynamicTypeHandler,
             local_38->Attributes,propertyId,_propertyIndex);
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,propertyId,pvVar14,possibleSideEffects);
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & PropertyOperation_ThrowIfNotExtensible) != 0;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((attributes & PropertyLetConstGlobal) != (descriptor->Attributes & PropertyLetConstGlobal))
            {
                // We have a shadowing case here.  Either a let/const is being declared
                // that shadows an undeclared global property or an undeclared global
                // property is being added after a let/const was already declared.
                //
                // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
                // because we do not want to add another property index field to the
                // property descriptors.  Instead convert to DictionaryTypeHandler
                // where it will reuse one of the getter/setter fields on its
                // property descriptor type.
                //
                // An exception is in the language service that will sometimes execute
                // the glo function twice causing a const or let appear to shadow itself.
                // In this case setting the property is also right.
                return
                    ConvertToDictionaryType(instance)
                        ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
            }

            if (descriptor->Attributes & PropertyDeleted && !(descriptor->Attributes & PropertyLetConstGlobal))
            {
                Assert((descriptor->Attributes & PropertyLetConstGlobal) == 0);
                if(GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else if (instance->GetDynamicType()->GetIsLocked())
                {
                    Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                    // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                    instance->ChangeType();
                }

                if(isUnordered)
                {
                    TPropertyIndex propertyIndex;
                    if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                    {
                        Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord));
                        descriptor = propertyMap->GetReferenceAt(propertyIndex);
                    }
                }

                if (IsNotExtensibleSupported)
                {
                    bool isForce = (flags & PropertyOperation_Force) != 0;
                    if (!isForce)
                    {
                        if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                        {
                            return FALSE;
                        }
                    }
                }

                if(SupportsSwitchingToUnordered(scriptContext))
                {
                    --numDeletedProperties;
                }
                scriptContext->InvalidateProtoCaches(propertyId);
                descriptor->Attributes = PropertyDynamicTypeDefaults;
            }

            if (descriptor->Attributes != attributes)
            {
                if (GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else
                {
                    if (instance->GetDynamicType()->GetIsLocked())
                    {
                        Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                        // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                        instance->ChangeType();
                    }

                    descriptor->Attributes = attributes;
                }
            }

            if (descriptor->propertyIndex != NoSlots)
            {
#if ENABLE_FIXED_FIELDS
                DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
                Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
                if (!descriptor->isInitialized)
                {
                    if ((flags & PropertyOperation_PreInit) == 0)
                    {
                        // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                        // some other special illegal value (for let or const), currently == null.
                        descriptor->isInitialized = true;
                        if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) && (flags & (PropertyOperation_SpecialValue | PropertyOperation_NonFixedValue)) == 0)
                        {
                            Assert(!GetIsShared());
                            Assert(value != nullptr);
                            // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                            Assert(!instance->IsExternal());
                            descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                        }
                    }
                }
                else
                {
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
                }
#endif
                SetSlotUnchecked(instance, descriptor->propertyIndex, value);

                if (!descriptor->IsOrMayBecomeFixed())
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
            }

            if (descriptor->Attributes & PropertyEnumerable)
            {
                instance->SetHasNoEnumerableProperties(false);
            }

            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);

            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyRecord. May create objectArray.
        if (propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetItemWithAttributes(instance, propertyRecord->GetNumericValue(), value, attributes);
        }

        return this->AddProperty(instance, propertyRecord, value, attributes, info, flags, possibleSideEffects);
    }